

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_function_helper
          (xpath_parser *this,ast_type_t type0,ast_type_t type1,size_t argc,xpath_ast_node **args)

{
  byte bVar1;
  char cVar2;
  double dVar3;
  double dVar4;
  lexeme_t lVar5;
  nodetest_t nVar6;
  xpath_ast_node *pxVar7;
  xpath_ast_node *pxVar8;
  char_t *pcVar9;
  xpath_ast_node *pxVar10;
  xpath_ast_node *pxVar11;
  xpath_ast_node **ppxVar12;
  long lVar13;
  xpath_parser *pxVar14;
  xpath_context *c;
  xpath_parser *pxVar15;
  char cVar16;
  xpath_ast_node *pxVar17;
  char *pcVar18;
  char *pcVar19;
  xpath_allocator_capture *this_00;
  xpath_ast_node *unaff_R12;
  xpath_node *pxVar20;
  xpath_parser *unaff_R13;
  undefined7 uVar21;
  xpath_memory_block *pxVar22;
  xpath_string xVar23;
  xpath_allocator_capture xStack_138;
  xpath_allocator *pxStack_120;
  xpath_memory_block *pxStack_118;
  xpath_memory_block *pxStack_110;
  xpath_node_set_raw xStack_100;
  xpath_allocator_capture xStack_e0;
  xpath_allocator_capture xStack_c8;
  xpath_parser *pxStack_b0;
  xpath_ast_node *pxStack_a8;
  xpath_parser *pxStack_a0;
  xpath_ast_node *pxStack_98;
  xpath_ast_node *pxStack_90;
  xpath_ast_node *pxStack_88;
  xpath_parser *pxStack_78;
  xpath_lexer_string xStack_70;
  xpath_ast_node **ppxStack_58;
  
  pxVar17 = (xpath_ast_node *)(ulong)type1;
  pxVar8 = (xpath_ast_node *)(ulong)type0;
  if ((argc != 1) || ((*args)->_rettype == '\x01')) {
    pxVar7 = (xpath_ast_node *)alloc_node((xpath_parser *)this->_alloc);
    if (argc == 0) {
      pxVar17 = pxVar8;
    }
    pxVar8 = *args;
    pxVar7->_type = (char)pxVar17;
    pxVar7->_rettype = '\x03';
    pxVar7->_axis = '\0';
    pxVar7->_test = '\0';
    pxVar7->_left = pxVar8;
    pxVar7->_right = (xpath_ast_node *)0x0;
    pxVar7->_next = (xpath_ast_node *)0x0;
    return pxVar7;
  }
  pcVar18 = "Function has to be applied to node set";
  throw_error(this,"Function has to be applied to node set");
  ppxStack_58 = args;
  if (((xpath_ast_node *)pcVar18 != (xpath_ast_node *)0x0) &&
     (((xpath_ast_node *)pcVar18)->_rettype != '\x01')) {
    pxStack_88 = (xpath_ast_node *)0x11f9a5;
    throw_error(this,"Step has to be applied to node set");
LAB_0011f9a5:
    pxVar15 = this;
    pcVar19 = "Unrecognized node test";
    goto LAB_0011f9d0;
  }
  pxVar8 = (xpath_ast_node *)&this->_lexer;
  lVar5 = (this->_lexer)._cur_lexeme;
  if (lVar5 == lex_double_dot) {
    pxStack_88 = (xpath_ast_node *)0x11f3b5;
    xpath_lexer::next((xpath_lexer *)pxVar8);
    pxStack_88 = (xpath_ast_node *)0x11f3bd;
    pxVar8 = (xpath_ast_node *)alloc_node((xpath_parser *)this->_alloc);
    pxVar8->_type = '8';
    pxVar8->_rettype = '\x01';
    pxVar8->_axis = '\t';
    pxVar8->_test = '\x02';
LAB_0011f3c6:
    pxVar8->_left = (xpath_ast_node *)pcVar18;
    pxVar8->_right = (xpath_ast_node *)0x0;
    pxVar8->_next = (xpath_ast_node *)0x0;
    (pxVar8->_data).string = (char_t *)0x0;
    return pxVar8;
  }
  if (lVar5 == lex_dot) {
    pxStack_88 = (xpath_ast_node *)0x11f39d;
    xpath_lexer::next((xpath_lexer *)pxVar8);
    pxStack_88 = (xpath_ast_node *)0x11f3a5;
    pxVar8 = (xpath_ast_node *)alloc_node((xpath_parser *)this->_alloc);
    pxVar8->_type = '8';
    pxVar8->_rettype = '\x01';
    pxVar8->_axis = '\f';
    pxVar8->_test = '\x02';
    goto LAB_0011f3c6;
  }
  uVar21 = (undefined7)((ulong)unaff_R13 >> 8);
  pxStack_78 = this;
  if (lVar5 == lex_axis_attribute) {
    pxStack_88 = (xpath_ast_node *)0x11f38d;
    xpath_lexer::next((xpath_lexer *)pxVar8);
    lVar5 = (this->_lexer)._cur_lexeme;
    unaff_R13 = (xpath_parser *)CONCAT71(uVar21,2);
    pxVar17 = (xpath_ast_node *)CONCAT71((uint7)(uint3)(type1 >> 8),1);
  }
  else {
    unaff_R13 = (xpath_parser *)CONCAT71(uVar21,3);
    pxVar17 = (xpath_ast_node *)0x0;
  }
  pxVar15 = pxStack_78;
  xStack_70.begin = (char_t *)0x0;
  xStack_70.end = (char_t *)0x0;
  if (lVar5 == lex_multiply) {
LAB_0011f4f9:
    xStack_70.end = (char_t *)0x0;
    xStack_70.begin = (char_t *)0x0;
    pxStack_88 = (xpath_ast_node *)0x11f4fe;
    xpath_lexer::next((xpath_lexer *)pxVar8);
    cVar16 = '\a';
    goto LAB_0011f501;
  }
  if (lVar5 != lex_string) goto LAB_0011f9a5;
  unaff_R12 = (xpath_ast_node *)&(pxStack_78->_lexer)._cur_lexeme_contents;
  xStack_70.begin = (pxStack_78->_lexer)._cur_lexeme_contents.begin;
  xStack_70.end = (pxStack_78->_lexer)._cur_lexeme_contents.end;
  pxStack_88 = (xpath_ast_node *)0x11f417;
  xpath_lexer::next((xpath_lexer *)pxVar8);
  lVar5 = (pxVar15->_lexer)._cur_lexeme;
  if (lVar5 == lex_double_colon) {
    if ((char)pxVar17 != '\0') {
      pcVar19 = "Two axis specifiers in one step";
      goto LAB_0011f9d0;
    }
    bVar1 = *(byte *)(xpath_allocator **)xStack_70.begin;
    uVar21 = (undefined7)((ulong)unaff_R13 >> 8);
    argc = (size_t)xStack_70.end;
    if (bVar1 < 0x6e) {
      switch(bVar1) {
      case 0x61:
        pxVar14 = (xpath_parser *)((long)xStack_70.end - (long)xStack_70.begin);
        if (pxVar14 != (xpath_parser *)0x0) {
          lVar13 = 0;
          do {
            if ("ancestor"[lVar13] != *(char *)(lVar13 + (long)(xpath_allocator **)xStack_70.begin))
            goto LAB_0011f492;
            lVar13 = lVar13 + 1;
          } while (pxVar14 != (xpath_parser *)lVar13);
        }
        if ("ancestor"[(long)pxVar14] == '\0') {
          unaff_R13 = (xpath_parser *)0x0;
        }
        else {
LAB_0011f492:
          if (xStack_70.end != xStack_70.begin) {
            lVar13 = 0;
            do {
              if ("ancestor-or-self"[lVar13] !=
                  *(char *)(lVar13 + (long)(xpath_allocator **)xStack_70.begin)) goto LAB_0011f4c3;
              lVar13 = lVar13 + 1;
            } while (pxVar14 != (xpath_parser *)lVar13);
          }
          if (*(undefined1 *)((long)&pxVar14[0x41ab]._query + 6) != '\0') {
LAB_0011f4c3:
            if (xStack_70.end != xStack_70.begin) {
              argc = 0;
              do {
                if (*(char *)((long)&(((xpath_parser *)(argc + 0x126198))->_lexer).
                                     _cur_lexeme_contents.end + 5) !=
                    *(char *)((long)(xpath_allocator **)xStack_70.begin + argc))
                goto switchD_0011f45c_caseD_62;
                argc = (long)&((xpath_parser *)argc)->_alloc + 1;
              } while (pxVar14 != (xpath_parser *)argc);
            }
            pcVar19 = "attribute";
            unaff_R13 = (xpath_parser *)CONCAT71(uVar21,2);
            goto LAB_0011f7ae;
          }
          unaff_R13 = (xpath_parser *)CONCAT71(uVar21,1);
        }
        break;
      default:
        goto switchD_0011f45c_caseD_62;
      case 99:
        argc = (long)xStack_70.end - (long)xStack_70.begin;
        if ((xpath_parser *)argc != (xpath_parser *)0x0) {
          lVar13 = 0;
          do {
            if ("child"[lVar13] != *(char *)(lVar13 + (long)(xpath_allocator **)xStack_70.begin))
            goto switchD_0011f45c_caseD_62;
            lVar13 = lVar13 + 1;
          } while (argc != lVar13);
        }
        pcVar19 = "child";
        unaff_R13 = (xpath_parser *)CONCAT71(uVar21,3);
        goto LAB_0011f7e7;
      case 100:
        pxVar14 = (xpath_parser *)((long)xStack_70.end - (long)xStack_70.begin);
        if (pxVar14 != (xpath_parser *)0x0) {
          lVar13 = 0;
          do {
            if ("descendant"[lVar13] !=
                *(char *)(lVar13 + (long)(xpath_allocator **)xStack_70.begin)) goto LAB_0011f6e8;
            lVar13 = lVar13 + 1;
          } while (pxVar14 != (xpath_parser *)lVar13);
        }
        if ("descendant"[(long)pxVar14] == '\0') {
          unaff_R13 = (xpath_parser *)CONCAT71(uVar21,4);
        }
        else {
LAB_0011f6e8:
          if (xStack_70.end != xStack_70.begin) {
            argc = 0;
            do {
              if (*(char *)&(((xpath_parser *)(argc + 0x127860))->_lexer)._cur_lexeme_pos !=
                  *(char *)((long)(xpath_allocator **)xStack_70.begin + argc))
              goto switchD_0011f45c_caseD_62;
              argc = (long)&((xpath_parser *)argc)->_alloc + 1;
            } while (pxVar14 != (xpath_parser *)argc);
          }
          pcVar19 = "descendant-or-self";
          unaff_R13 = (xpath_parser *)CONCAT71(uVar21,5);
LAB_0011f7ae:
          if (*(char *)((long)&pxVar14->_alloc + (long)pcVar19) != '\0')
          goto switchD_0011f45c_caseD_62;
        }
        break;
      case 0x66:
        pxVar14 = (xpath_parser *)((long)xStack_70.end - (long)xStack_70.begin);
        if (pxVar14 != (xpath_parser *)0x0) {
          lVar13 = 0;
          do {
            if ("following"[lVar13] != *(char *)(lVar13 + (long)(xpath_allocator **)xStack_70.begin)
               ) goto LAB_0011f64e;
            lVar13 = lVar13 + 1;
          } while (pxVar14 != (xpath_parser *)lVar13);
        }
        if ("following"[(long)pxVar14] != '\0') {
LAB_0011f64e:
          if (xStack_70.end != xStack_70.begin) {
            argc = 0;
            do {
              if ((((xpath_parser *)(argc + 0x127860))->_lexer).field_0x25 !=
                  *(char *)((long)(xpath_allocator **)xStack_70.begin + argc))
              goto switchD_0011f45c_caseD_62;
              argc = (long)&((xpath_parser *)argc)->_alloc + 1;
            } while (pxVar14 != (xpath_parser *)argc);
          }
          pcVar19 = "following-sibling";
          unaff_R13 = (xpath_parser *)CONCAT71(uVar21,7);
          goto LAB_0011f7ae;
        }
        unaff_R13 = (xpath_parser *)CONCAT71(uVar21,6);
      }
LAB_0011f7f1:
      pxStack_88 = (xpath_ast_node *)0x11f7fc;
      xpath_lexer::next((xpath_lexer *)pxVar8);
      lVar5 = (pxStack_78->_lexer)._cur_lexeme;
      if (lVar5 == lex_multiply) goto LAB_0011f4f9;
      this = (xpath_parser *)pxVar8;
      if (lVar5 != lex_string) goto LAB_0011f9a5;
      xStack_70.begin = ((xpath_lexer_string *)unaff_R12)->begin;
      xStack_70.end = (pxVar15->_lexer)._cur_lexeme_contents.end;
      pxStack_88 = (xpath_ast_node *)0x11f828;
      xpath_lexer::next((xpath_lexer *)pxVar8);
      lVar5 = (pxStack_78->_lexer)._cur_lexeme;
      goto LAB_0011f830;
    }
    if (bVar1 == 0x6e) {
      argc = (long)xStack_70.end - (long)xStack_70.begin;
      if ((xpath_parser *)argc != (xpath_parser *)0x0) {
        lVar13 = 0;
        do {
          if ("namespace"[lVar13] != *(char *)(lVar13 + (long)(xpath_allocator **)xStack_70.begin))
          goto switchD_0011f45c_caseD_62;
          lVar13 = lVar13 + 1;
        } while (argc != lVar13);
      }
      pcVar19 = "namespace";
      unaff_R13 = (xpath_parser *)CONCAT71(uVar21,8);
    }
    else {
      if (bVar1 == 0x70) {
        pxVar14 = (xpath_parser *)((long)xStack_70.end - (long)xStack_70.begin);
        if (pxVar14 != (xpath_parser *)0x0) {
          lVar13 = 0;
          do {
            if ("parent"[lVar13] != *(char *)(lVar13 + (long)(xpath_allocator **)xStack_70.begin))
            goto LAB_0011f74f;
            lVar13 = lVar13 + 1;
          } while (pxVar14 != (xpath_parser *)lVar13);
        }
        if ("parent"[(long)pxVar14] == '\0') {
          unaff_R13 = (xpath_parser *)CONCAT71(uVar21,9);
        }
        else {
LAB_0011f74f:
          if (xStack_70.end != xStack_70.begin) {
            lVar13 = 0;
            do {
              if ("preceding"[lVar13] !=
                  *(char *)(lVar13 + (long)(xpath_allocator **)xStack_70.begin)) goto LAB_0011f780;
              lVar13 = lVar13 + 1;
            } while (pxVar14 != (xpath_parser *)lVar13);
          }
          if ("preceding"[(long)pxVar14] != '\0') {
LAB_0011f780:
            if (xStack_70.end != xStack_70.begin) {
              argc = 0;
              do {
                if (*(char *)((long)&(((xpath_parser *)(argc + 0x1278a8))->_lexer)._cur_lexeme_pos +
                             2) != *(char *)((long)(xpath_allocator **)xStack_70.begin + argc))
                goto switchD_0011f45c_caseD_62;
                argc = (long)&((xpath_parser *)argc)->_alloc + 1;
              } while (pxVar14 != (xpath_parser *)argc);
            }
            pcVar19 = "preceding-sibling";
            unaff_R13 = (xpath_parser *)CONCAT71(uVar21,0xb);
            goto LAB_0011f7ae;
          }
          unaff_R13 = (xpath_parser *)CONCAT71(uVar21,10);
        }
        goto LAB_0011f7f1;
      }
      if (bVar1 != 0x73) goto switchD_0011f45c_caseD_62;
      argc = (long)xStack_70.end - (long)xStack_70.begin;
      if ((xpath_parser *)argc != (xpath_parser *)0x0) {
        lVar13 = 0;
        do {
          if ("ancestor-or-self"[lVar13 + 0xc] !=
              *(char *)(lVar13 + (long)(xpath_allocator **)xStack_70.begin))
          goto switchD_0011f45c_caseD_62;
          lVar13 = lVar13 + 1;
        } while (argc != lVar13);
      }
      pcVar19 = "self";
      unaff_R13 = (xpath_parser *)CONCAT71(uVar21,0xc);
    }
LAB_0011f7e7:
    if (pcVar19[(long)&((xpath_parser *)argc)->_alloc] == '\0') goto LAB_0011f7f1;
switchD_0011f45c_caseD_62:
    pcVar19 = "Unknown axis";
  }
  else {
LAB_0011f830:
    if (lVar5 != lex_open_brace) {
      argc = (long)xStack_70.end - (long)xStack_70.begin;
      cVar16 = '\x01';
      if (((2 < (long)argc) &&
          (*(char *)((long)&((xpath_parser *)((long)xStack_70.end + -0x48))->_result + 6) == ':'))
         && (*(char *)((long)&((xpath_parser *)((long)xStack_70.end + -0x48))->_result + 7) == '*'))
      {
        xStack_70.end =
             (char_t *)((long)&((xpath_parser *)((long)xStack_70.end + -0x48))->_result + 7);
        cVar16 = '\b';
      }
LAB_0011f501:
      pxVar15 = pxStack_78;
      pxStack_88 = (xpath_ast_node *)0x11f50e;
      unaff_R12 = (xpath_ast_node *)alloc_node((xpath_parser *)pxStack_78->_alloc);
      pxStack_88 = (xpath_ast_node *)0x11f51e;
      pcVar9 = alloc_string((xpath_parser *)pxVar15->_alloc,&xStack_70);
      unaff_R12->_type = '8';
      unaff_R12->_rettype = '\x01';
      unaff_R12->_axis = (char)unaff_R13;
      unaff_R12->_test = cVar16;
      unaff_R12->_left = (xpath_ast_node *)pcVar18;
      unaff_R12->_right = (xpath_ast_node *)0x0;
      unaff_R12->_next = (xpath_ast_node *)0x0;
      (unaff_R12->_data).string = pcVar9;
      if ((pxVar15->_lexer)._cur_lexeme != lex_open_square_brace) {
        return unaff_R12;
      }
      pxVar17 = (xpath_ast_node *)&unaff_R12->_right;
      unaff_R13 = pxVar15;
      pxVar7 = (xpath_ast_node *)0x0;
      while( true ) {
        pxStack_88 = (xpath_ast_node *)0x11f55e;
        xpath_lexer::next((xpath_lexer *)pxVar8);
        pxStack_88 = (xpath_ast_node *)0x11f566;
        pxVar10 = parse_expression(unaff_R13);
        pxStack_88 = (xpath_ast_node *)0x11f576;
        pxVar11 = (xpath_ast_node *)alloc_node((xpath_parser *)pxStack_78->_alloc);
        unaff_R13 = pxStack_78;
        pxVar11->_type = '\x0f';
        pxVar11->_rettype = '\x01';
        pxVar11->_axis = '\0';
        pxVar11->_test = '\0';
        pxVar11->_left = pxVar10;
        pxVar11->_right = (xpath_ast_node *)0x0;
        pxVar11->_next = (xpath_ast_node *)0x0;
        if ((pxStack_78->_lexer)._cur_lexeme != lex_close_square_brace) break;
        pxStack_88 = (xpath_ast_node *)0x11f5a2;
        xpath_lexer::next((xpath_lexer *)pxVar8);
        ppxVar12 = &pxVar7->_next;
        if (pxVar7 == (xpath_ast_node *)0x0) {
          ppxVar12 = (xpath_ast_node **)pxVar17;
        }
        *ppxVar12 = pxVar11;
        pxVar7 = pxVar11;
        pcVar18 = (char *)pxVar11;
        if ((unaff_R13->_lexer)._cur_lexeme != lex_open_square_brace) {
          return unaff_R12;
        }
      }
      pxStack_88 = (xpath_ast_node *)0x11f984;
      throw_error(pxStack_78,"Unmatched square brace");
      pxVar15 = (xpath_parser *)pxVar8;
      pxVar8 = pxVar7;
      goto switchD_0011f45c_caseD_62;
    }
    pxStack_88 = (xpath_ast_node *)0x11f840;
    xpath_lexer::next((xpath_lexer *)pxVar8);
    lVar5 = (pxStack_78->_lexer)._cur_lexeme;
    if (lVar5 == lex_close_brace) {
      pxStack_88 = (xpath_ast_node *)0x11f855;
      xpath_lexer::next((xpath_lexer *)pxVar8);
      pxStack_88 = (xpath_ast_node *)0x11f864;
      nVar6 = parse_node_test_type
                        ((xpath_parser *)xStack_70.begin,(xpath_lexer_string *)xStack_70.end);
      if (nVar6 != nodetest_none) {
        cVar16 = (char)nVar6;
        xStack_70.begin = (char_t *)0x0;
        xStack_70.end = (char_t *)0x0;
        goto LAB_0011f501;
      }
      pcVar19 = "Unrecognized node type";
      pxVar15 = (xpath_parser *)pxVar8;
    }
    else {
      argc = (long)xStack_70.end - (long)xStack_70.begin;
      if ((xpath_parser *)argc != (xpath_parser *)0x0) {
        lVar13 = 0;
        do {
          if ("processing-instruction"[lVar13] !=
              *(char *)(lVar13 + (long)(xpath_allocator **)xStack_70.begin)) goto LAB_0011f98d;
          lVar13 = lVar13 + 1;
        } while (argc != lVar13);
      }
      if (*(char *)((long)&(((xpath_parser *)(argc + 0x127500))->_lexer)._cur + 2) == '\0') {
        if (lVar5 == lex_quoted_string) {
          xStack_70.begin = ((xpath_lexer_string *)unaff_R12)->begin;
          xStack_70.end = (pxVar15->_lexer)._cur_lexeme_contents.end;
          pxStack_88 = (xpath_ast_node *)0x11f926;
          xpath_lexer::next((xpath_lexer *)pxVar8);
          if ((pxStack_78->_lexer)._cur_lexeme == lex_close_brace) {
            pxStack_88 = (xpath_ast_node *)0x11f93d;
            xpath_lexer::next((xpath_lexer *)pxVar8);
            cVar16 = '\x06';
            goto LAB_0011f501;
          }
          pcVar19 = "Unmatched brace near processing-instruction()";
          pxVar15 = (xpath_parser *)pxVar8;
        }
        else {
          pcVar19 = "Only literals are allowed as arguments to processing-instruction()";
          pxVar15 = (xpath_parser *)pxVar8;
        }
      }
      else {
LAB_0011f98d:
        pcVar19 = "Unmatched brace near node type test";
        pxVar15 = (xpath_parser *)pxVar8;
      }
    }
  }
LAB_0011f9d0:
  pxStack_88 = (xpath_ast_node *)
               xpath_ast_node::compare_rel<pugi::impl::(anonymous_namespace)::less>;
  pxVar14 = pxStack_78;
  throw_error(pxStack_78,pcVar19);
  cVar16 = *(char *)((long)&pxVar14->_alloc + 1);
  cVar2 = ((xpath_ast_node *)pcVar19)->_rettype;
  pxStack_b0 = pxVar15;
  pxStack_a8 = unaff_R12;
  pxStack_a0 = unaff_R13;
  pxStack_98 = pxVar8;
  pxStack_90 = (xpath_ast_node *)pcVar18;
  pxStack_88 = pxVar17;
  if (cVar2 != '\x01' && cVar16 != '\x01') {
    dVar3 = xpath_ast_node::eval_number((xpath_ast_node *)pxVar14,c,(xpath_stack *)argc);
    dVar4 = xpath_ast_node::eval_number((xpath_ast_node *)pcVar19,c,(xpath_stack *)argc);
    pxVar17 = (xpath_ast_node *)CONCAT71((int7)((ulong)pxVar17 >> 8),dVar3 < dVar4);
    goto LAB_0011fce1;
  }
  if (cVar2 == '\x01' && cVar16 == '\x01') {
    xStack_138._target = ((xpath_parser *)argc)->_alloc;
    xStack_138._state._root = (xStack_138._target)->_root;
    xStack_138._state._root_size = (xStack_138._target)->_root_size;
    xpath_ast_node::eval_node_set(&xStack_100,(xpath_ast_node *)pxVar14,c,(xpath_stack *)argc);
    xpath_ast_node::eval_node_set
              ((xpath_node_set_raw *)&pxStack_120,(xpath_ast_node *)pcVar19,c,(xpath_stack *)argc);
    if (xStack_100._begin != xStack_100._end) {
      pxVar20 = xStack_100._begin;
      do {
        xStack_e0._target = ((xpath_parser *)argc)->_alloc;
        xStack_e0._state._root = (xStack_e0._target)->_root;
        xStack_e0._state._root_size = (xStack_e0._target)->_root_size;
        xVar23 = string_value((anon_unknown_0 *)(pxVar20->_node)._root,
                              (xpath_node *)(pxVar20->_attribute)._attr,xStack_e0._target);
        dVar3 = convert_string_to_number(xVar23._buffer);
        for (pxVar22 = pxStack_118; pxVar22 != pxStack_110;
            pxVar22 = (xpath_memory_block *)(pxVar22->data + 8)) {
          xStack_c8._target = ((xpath_parser *)argc)->_alloc;
          xStack_c8._state._root = (xStack_c8._target)->_root;
          xStack_c8._state._root_size = (xStack_c8._target)->_root_size;
          xVar23 = string_value((anon_unknown_0 *)pxVar22->next,*(xpath_node **)pxVar22->data,
                                xStack_c8._target);
          dVar4 = convert_string_to_number(xVar23._buffer);
          xpath_allocator_capture::~xpath_allocator_capture(&xStack_c8);
          if (dVar3 < dVar4) {
            xpath_allocator_capture::~xpath_allocator_capture(&xStack_e0);
            pxVar17 = (xpath_ast_node *)CONCAT71((int7)((ulong)&xStack_c8._state >> 8),1);
            goto LAB_0011fc1f;
          }
        }
        xpath_allocator_capture::~xpath_allocator_capture(&xStack_e0);
        pxVar20 = pxVar20 + 1;
      } while (pxVar20 != xStack_100._end);
    }
    pxVar17 = (xpath_ast_node *)0x0;
LAB_0011fc1f:
    this_00 = &xStack_138;
  }
  else {
    if (cVar16 == '\x01' || cVar2 != '\x01') {
      if ((cVar16 != '\x01') || (cVar2 == '\x01')) {
        __assert_fail("!\"Wrong types\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                      ,0x1d8b,
                      "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_rel(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::less]"
                     );
      }
      pxStack_120 = ((xpath_parser *)argc)->_alloc;
      pxStack_118 = pxStack_120->_root;
      pxStack_110 = (xpath_memory_block *)pxStack_120->_root_size;
      xpath_ast_node::eval_node_set(&xStack_100,(xpath_ast_node *)pxVar14,c,(xpath_stack *)argc);
      dVar3 = xpath_ast_node::eval_number((xpath_ast_node *)pcVar19,c,(xpath_stack *)argc);
      if (xStack_100._begin == xStack_100._end) goto LAB_0011fcd5;
      pxVar20 = xStack_100._begin;
      do {
        xStack_138._target = ((xpath_parser *)argc)->_alloc;
        xStack_138._state._root = (xStack_138._target)->_root;
        xStack_138._state._root_size = (xStack_138._target)->_root_size;
        xVar23 = string_value((anon_unknown_0 *)(pxVar20->_node)._root,
                              (xpath_node *)(pxVar20->_attribute)._attr,xStack_138._target);
        dVar4 = convert_string_to_number(xVar23._buffer);
        xpath_allocator_capture::~xpath_allocator_capture(&xStack_138);
        pxVar17 = (xpath_ast_node *)CONCAT71((int7)((ulong)pxVar17 >> 8),dVar4 < dVar3);
        if (dVar4 < dVar3) break;
        pxVar20 = pxVar20 + 1;
      } while (pxVar20 != xStack_100._end);
    }
    else {
      pxStack_120 = ((xpath_parser *)argc)->_alloc;
      pxStack_118 = pxStack_120->_root;
      pxStack_110 = (xpath_memory_block *)pxStack_120->_root_size;
      dVar3 = xpath_ast_node::eval_number((xpath_ast_node *)pxVar14,c,(xpath_stack *)argc);
      xpath_ast_node::eval_node_set(&xStack_100,(xpath_ast_node *)pcVar19,c,(xpath_stack *)argc);
      if (xStack_100._begin == xStack_100._end) {
LAB_0011fcd5:
        pxVar17 = (xpath_ast_node *)0x0;
      }
      else {
        pxVar20 = xStack_100._begin;
        do {
          xStack_138._target = ((xpath_parser *)argc)->_alloc;
          xStack_138._state._root = (xStack_138._target)->_root;
          xStack_138._state._root_size = (xStack_138._target)->_root_size;
          xVar23 = string_value((anon_unknown_0 *)(pxVar20->_node)._root,
                                (xpath_node *)(pxVar20->_attribute)._attr,xStack_138._target);
          dVar4 = convert_string_to_number(xVar23._buffer);
          xpath_allocator_capture::~xpath_allocator_capture(&xStack_138);
          pxVar17 = (xpath_ast_node *)CONCAT71((int7)((ulong)pxVar17 >> 8),dVar3 < dVar4);
          if (dVar3 < dVar4) break;
          pxVar20 = pxVar20 + 1;
        } while (pxVar20 != xStack_100._end);
      }
    }
    this_00 = (xpath_allocator_capture *)&pxStack_120;
  }
  xpath_allocator_capture::~xpath_allocator_capture(this_00);
LAB_0011fce1:
  return (xpath_ast_node *)((ulong)pxVar17 & 0xffffffff);
}

Assistant:

xpath_ast_node* parse_function_helper(ast_type_t type0, ast_type_t type1, size_t argc, xpath_ast_node* args[2])
		{
			assert(argc <= 1);

			if (argc == 1 && args[0]->rettype() != xpath_type_node_set) throw_error("Function has to be applied to node set");

			return new (alloc_node()) xpath_ast_node(argc == 0 ? type0 : type1, xpath_type_string, args[0]);
		}